

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManPermuteInputs(Gia_Man_t *p,int nPpis,int nExtra)

{
  char *pcVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  Gia_Man_t *p_00;
  size_t sVar4;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  Vec_Int_t *pVVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pcVar1);
    pcVar5 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar5,pcVar1);
  }
  p_00->pName = pcVar5;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pcVar1);
    pcVar5 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar5,pcVar1);
  }
  p_00->pSpec = pcVar5;
  p->pObjs->Value = 0;
  iVar9 = p->vCis->nSize - p->nRegs;
  iVar8 = nPpis + nExtra;
  if (0 < iVar9 - iVar8) {
    lVar12 = 0;
    do {
      pGVar6 = Gia_ManAppendObj(p_00);
      uVar13 = *(ulong *)pGVar6;
      *(ulong *)pGVar6 = uVar13 | 0x9fffffff;
      *(ulong *)pGVar6 =
           uVar13 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar2 = p_00->pObjs;
      if ((pGVar6 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar6)) goto LAB_001e75e3;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * -0x55555555);
      pGVar2 = p_00->pObjs;
      if ((pGVar6 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar6)) goto LAB_001e75e3;
      if (p->vCis->nSize <= lVar12) goto LAB_001e7621;
      iVar9 = p->vCis->pArray[lVar12];
      if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) goto LAB_001e7602;
      p->pObjs[iVar9].Value = (int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * 0x55555556;
      lVar12 = lVar12 + 1;
      iVar9 = p->vCis->nSize - p->nRegs;
    } while (lVar12 < iVar9 - iVar8);
  }
  uVar10 = iVar9 - nExtra;
  iVar9 = p->vCis->nSize - p->nRegs;
  if ((int)uVar10 < iVar9) {
    uVar13 = (ulong)uVar10;
    do {
      pGVar6 = Gia_ManAppendObj(p_00);
      uVar3 = *(ulong *)pGVar6;
      *(ulong *)pGVar6 = uVar3 | 0x9fffffff;
      *(ulong *)pGVar6 =
           uVar3 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar2 = p_00->pObjs;
      if ((pGVar6 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar6)) goto LAB_001e75e3;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * -0x55555555);
      pGVar2 = p_00->pObjs;
      if ((pGVar6 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar6)) goto LAB_001e75e3;
      if (((int)uVar10 < 0) || (p->vCis->nSize <= (int)uVar13)) goto LAB_001e7621;
      iVar9 = p->vCis->pArray[uVar13];
      if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) goto LAB_001e7602;
      p->pObjs[iVar9].Value = (int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * 0x55555556;
      uVar13 = uVar13 + 1;
      iVar9 = p->vCis->nSize - p->nRegs;
    } while ((int)uVar13 < iVar9);
  }
  uVar10 = p->vCis->nSize - p->nRegs;
  uVar11 = iVar9 - iVar8;
  if ((int)uVar11 < (int)(uVar10 - nExtra)) {
    uVar13 = (ulong)uVar11;
    do {
      pGVar6 = Gia_ManAppendObj(p_00);
      uVar3 = *(ulong *)pGVar6;
      *(ulong *)pGVar6 = uVar3 | 0x9fffffff;
      *(ulong *)pGVar6 =
           uVar3 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar2 = p_00->pObjs;
      if ((pGVar6 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar6)) goto LAB_001e75e3;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * -0x55555555);
      pGVar2 = p_00->pObjs;
      if ((pGVar6 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar6)) goto LAB_001e75e3;
      if (((int)uVar11 < 0) || (p->vCis->nSize <= (int)uVar13)) goto LAB_001e7621;
      iVar8 = p->vCis->pArray[uVar13];
      if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_001e7602;
      p->pObjs[iVar8].Value = (int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * 0x55555556;
      uVar10 = p->vCis->nSize - p->nRegs;
      uVar13 = uVar13 + 1;
    } while ((int)uVar13 < (int)(uVar10 - nExtra));
  }
  iVar8 = p->vCis->nSize;
  if ((int)uVar10 < iVar8) {
    uVar13 = (ulong)uVar10;
    do {
      pGVar6 = Gia_ManAppendObj(p_00);
      uVar3 = *(ulong *)pGVar6;
      *(ulong *)pGVar6 = uVar3 | 0x9fffffff;
      *(ulong *)pGVar6 =
           uVar3 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar2 = p_00->pObjs;
      if ((pGVar6 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar6)) {
LAB_001e75e3:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * -0x55555555);
      pGVar2 = p_00->pObjs;
      if ((pGVar6 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar6)) goto LAB_001e75e3;
      if (((int)uVar10 < 0) || (p->vCis->nSize <= (int)uVar13)) {
LAB_001e7621:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar8 = p->vCis->pArray[uVar13];
      if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_001e7602;
      p->pObjs[iVar8].Value = (int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * 0x55555556;
      uVar13 = uVar13 + 1;
      iVar8 = p->vCis->nSize;
    } while ((int)uVar13 < iVar8);
  }
  if (p_00->vCis->nSize != iVar8) {
    __assert_fail("Gia_ManCiNum(pNew) == Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x9bf,"Gia_Man_t *Gia_ManPermuteInputs(Gia_Man_t *, int, int)");
  }
  if (0 < p->nObjs) {
    lVar14 = 8;
    lVar12 = 0;
    do {
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      uVar13 = *(ulong *)((long)pGVar2 + lVar14 + -8);
      if ((uVar13 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar13) {
        uVar10 = *(uint *)((long)pGVar2 +
                          lVar14 + (ulong)(uint)((int)(uVar13 & 0x1fffffff) << 2) * -3);
        if (((int)uVar10 < 0) ||
           (uVar11 = *(uint *)((long)pGVar2 +
                              lVar14 + (ulong)((uint)(uVar13 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar11 < 0)) goto LAB_001e7640;
        iVar8 = Gia_ManAppendAnd(p_00,uVar10 ^ (uint)(uVar13 >> 0x1d) & 1,
                                 uVar11 ^ (uint)(uVar13 >> 0x3d) & 1);
        *(int *)(&pGVar2->field_0x0 + lVar14) = iVar8;
      }
      lVar12 = lVar12 + 1;
      lVar14 = lVar14 + 0xc;
    } while (lVar12 < p->nObjs);
  }
  pVVar7 = p->vCos;
  if (0 < pVVar7->nSize) {
    lVar12 = 0;
    do {
      iVar8 = pVVar7->pArray[lVar12];
      if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) {
LAB_001e7602:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = p->pObjs + iVar8;
      if ((int)pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].Value < 0) {
LAB_001e7640:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar10 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar2 >> 0x1d & 1 ^
                                    pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].Value
                              );
      pGVar2->Value = uVar10;
      lVar12 = lVar12 + 1;
      pVVar7 = p->vCos;
    } while (lVar12 < pVVar7->nSize);
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManPermuteInputs( Gia_Man_t * p, int nPpis, int nExtra )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    for ( i = 0; i < Gia_ManPiNum(p) - nPpis - nExtra; i++ ) // regular PIs
        Gia_ManCi(p, i)->Value = Gia_ManAppendCi( pNew );
    for ( i = Gia_ManPiNum(p) - nExtra; i < Gia_ManPiNum(p); i++ ) // extra PIs due to DC values
        Gia_ManCi(p, i)->Value = Gia_ManAppendCi( pNew );
    for ( i = Gia_ManPiNum(p) - nPpis - nExtra; i < Gia_ManPiNum(p) - nExtra; i++ ) // pseudo-PIs
        Gia_ManCi(p, i)->Value = Gia_ManAppendCi( pNew );
    for ( i = Gia_ManPiNum(p); i < Gia_ManCiNum(p); i++ ) // flop outputs
        Gia_ManCi(p, i)->Value = Gia_ManAppendCi( pNew );
    assert( Gia_ManCiNum(pNew) == Gia_ManCiNum(p) );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}